

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint32_t dynamic_croaring_detect_supported_architectures(void)

{
  long lVar1;
  uint uVar2;
  uint32_t c;
  
  lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
  uVar2 = *(uint *)(lVar1 + 4);
  lVar1 = cpuid_Version_info(1);
  return (*(uint *)(lVar1 + 0xc) >> 0x11 & 8 |
         uVar2 >> 2 & 0x40 | (uVar2 >> 3 & 4) + (uVar2 & 8) * 4) + (*(uint *)(lVar1 + 0xc) & 2) * 8;
}

Assistant:

static inline uint32_t dynamic_croaring_detect_supported_architectures() {
  uint32_t eax, ebx, ecx, edx;
  uint32_t host_isa = 0x0;
  // Can be found on Intel ISA Reference for CPUID
  static uint32_t cpuid_avx2_bit = 1 << 5;      ///< @private Bit 5 of EBX for EAX=0x7
  static uint32_t cpuid_bmi1_bit = 1 << 3;      ///< @private bit 3 of EBX for EAX=0x7
  static uint32_t cpuid_bmi2_bit = 1 << 8;      ///< @private bit 8 of EBX for EAX=0x7
  static uint32_t cpuid_sse42_bit = 1 << 20;    ///< @private bit 20 of ECX for EAX=0x1
  static uint32_t cpuid_pclmulqdq_bit = 1 << 1; ///< @private bit  1 of ECX for EAX=0x1
  // ECX for EAX=0x7
  eax = 0x7;
  ecx = 0x0;
  cpuid(&eax, &ebx, &ecx, &edx);
  if (ebx & cpuid_avx2_bit) {
    host_isa |= CROARING_AVX2;
  }
  if (ebx & cpuid_bmi1_bit) {
    host_isa |= CROARING_BMI1;
  }

  if (ebx & cpuid_bmi2_bit) {
    host_isa |= CROARING_BMI2;
  }

  // EBX for EAX=0x1
  eax = 0x1;
  cpuid(&eax, &ebx, &ecx, &edx);

  if (ecx & cpuid_sse42_bit) {
    host_isa |= CROARING_SSE42;
  }

  if (ecx & cpuid_pclmulqdq_bit) {
    host_isa |= CROARING_PCLMULQDQ;
  }

  return host_isa;
}